

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

void setupScale(Layer *l,int scale)

{
  undefined4 in_ESI;
  long in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  *(undefined4 *)(in_RDI + 0xc) = in_ESI;
  if (*(long *)(in_RDI + 0x38) != 0) {
    setupScale((Layer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  if (*(long *)(in_RDI + 0x40) != 0) {
    setupScale((Layer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

static void setupScale(Layer *l, int scale)
{
    l->scale = scale;
    if (l->p)
        setupScale(l->p, scale * l->zoom);
    if (l->p2)
        setupScale(l->p2, scale * l->zoom);
}